

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

void __thiscall IPStats::SubmitCborPacket(IPStats *this,cdns *cdns_ctx,size_t packet_id)

{
  int iVar1;
  pointer pcVar2;
  size_t __n;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  pointer pcVar8;
  bool stored;
  IPStatsRecord ipsr;
  
  memset(&ipsr,0,0x368);
  pcVar2 = (cdns_ctx->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1 = cdns_ctx->index_offset;
  lVar7 = (long)iVar1;
  if (iVar1 <= pcVar2[packet_id].client_address_index) {
    lVar6 = pcVar2[packet_id].client_address_index - lVar7;
    pcVar3 = (cdns_ctx->block).tables.addresses.
             super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = pcVar3[lVar6].l;
    if ((__n != 0x10) && (__n != 4)) {
      return;
    }
    ipsr.ipaddr_length = __n;
    memcpy(ipsr.ip_addr,pcVar3[lVar6].v,__n);
    if ((__n != 0x10) && (__n != 4)) {
      return;
    }
  }
  if (pcVar2[packet_id].query_signature_index < iVar1) {
    pcVar8 = (pointer)0x0;
  }
  else {
    pcVar8 = (cdns_ctx->block).tables.q_sigs.
             super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>._M_impl
             .super__Vector_impl_data._M_start + (pcVar2[packet_id].query_signature_index - lVar7);
  }
  ipsr.query_volume = ipsr.query_volume + 1;
  if ((((pcVar8 != (pointer)0x0) && (iVar1 <= pcVar2[packet_id].query_name_index)) &&
      (lVar7 = pcVar2[packet_id].query_name_index - lVar7,
      pcVar3 = (cdns_ctx->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start,
      bVar5 = IPStatsRecord::SetQName(&ipsr,pcVar3[lVar7].v,(uint32_t)pcVar3[lVar7].l,this), bVar5))
     && (bVar5 = IPStatsRecord::SetTime(&ipsr,(cdns_ctx->block).preamble.earliest_time_sec), bVar5))
  {
    if (pcVar2[packet_id].query_name_index < cdns_ctx->index_offset) {
      if (!bVar5) {
        return;
      }
    }
    else {
      lVar7 = (long)pcVar8->query_classtype_index - (long)cdns_ctx->index_offset;
      pcVar4 = (cdns_ctx->block).tables.class_ids.
               super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
               super__Vector_impl_data._M_start;
      IPStatsRecord::SetRR(&ipsr,pcVar4[lVar7].rr_type,pcVar4[lVar7].rr_class);
    }
    stored = false;
    BinHash<IPStatsRecord>::InsertOrAdd(&this->ip_records,&ipsr,true,&stored);
  }
  return;
}

Assistant:

void IPStats::SubmitCborPacket(cdns* cdns_ctx, size_t packet_id)
{
    /* TODO: add to database. */
    bool is_valid = true;
    IPStatsRecord ipsr;
    cdns_query* query = &cdns_ctx->block.queries[packet_id];
    cdns_query_signature* q_sig = NULL;

    if (query->client_address_index >= cdns_ctx->index_offset){
        size_t addrid = (size_t)query->client_address_index - cdns_ctx->index_offset;
        if (!ipsr.SetIP(cdns_ctx->block.tables.addresses[addrid].l, cdns_ctx->block.tables.addresses[addrid].v)) {
            /* malformed IP address. Cannot do anything with that record. */
            is_valid = false;
        }
    }

    if (is_valid) {
        if (query->query_signature_index >= cdns_ctx->index_offset) {
            q_sig = &cdns_ctx->block.tables.q_sigs[(size_t)query->query_signature_index - cdns_ctx->index_offset];
        }


        ipsr.query_volume += 1;

        /* Queried name and response type */
        if (q_sig != NULL &&
            query->query_name_index >= cdns_ctx->index_offset) {
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            uint8_t* q_name = cdns_ctx->block.tables.name_rdata[nid].v;
            uint32_t q_name_length = (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l;
            is_valid = ipsr.SetQName(q_name, q_name_length, this);
        }
        else {
            is_valid = false;
        }
    }

    /* Set date */
    if (is_valid) {
        /* Find hour and date */
        is_valid = ipsr.SetTime(cdns_ctx->block.preamble.earliest_time_sec);
    }

    /* TODO: Set RR */
    if (is_valid) {
        /* Find qr_class, so leak analysis can distinguish between Internet and Chaos */
        int rr_class = 0;
        int rr_type = 0;
        if (q_sig != NULL &&
            query->query_name_index >= cdns_ctx->index_offset) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
            rr_type = cdns_ctx->block.tables.class_ids[cid].rr_type;
            is_valid = ipsr.SetRR(rr_type, rr_class);
        }
    }

    /* If the packet is valid, add the record to the table of addresses */
    if (is_valid) {
        bool stored = false;
        this->ip_records.InsertOrAdd(&ipsr, true, &stored);
    }
}